

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O0

Vec_Ptr_t * If_ManReverseOrder(If_Man_t *p)

{
  int iVar1;
  void *__s;
  uint *puVar2;
  Vec_Ptr_t *p_00;
  int local_2c;
  int i;
  If_Obj_t **ppStore;
  If_Obj_t *pObj;
  Vec_Ptr_t *vOrder;
  If_Man_t *p_local;
  
  __s = malloc((long)(p->nLevelMax + 1) << 3);
  memset(__s,0,(long)(p->nLevelMax + 1) << 3);
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= local_2c) {
      iVar1 = If_ManObjNum(p);
      p_00 = Vec_PtrAlloc(iVar1);
      for (local_2c = p->nLevelMax; -1 < local_2c; local_2c = local_2c + -1) {
        for (ppStore = *(If_Obj_t ***)((long)__s + (long)local_2c * 8); ppStore != (If_Obj_t **)0x0;
            ppStore = (If_Obj_t **)ppStore[8]) {
          Vec_PtrPush(p_00,ppStore);
        }
      }
      if (__s != (void *)0x0) {
        free(__s);
      }
      return p_00;
    }
    puVar2 = (uint *)Vec_PtrEntry(p->vObjs,local_2c);
    if ((uint)p->nLevelMax < *puVar2 >> 0xd) break;
    *(undefined8 *)(puVar2 + 0x10) = *(undefined8 *)((long)__s + (ulong)(*puVar2 >> 0xd) * 8);
    *(uint **)((long)__s + (ulong)(*puVar2 >> 0xd) * 8) = puVar2;
    local_2c = local_2c + 1;
  }
  __assert_fail("pObj->Level >= 0 && pObj->Level <= (unsigned)p->nLevelMax",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifUtil.c"
                ,0x176,"Vec_Ptr_t *If_ManReverseOrder(If_Man_t *)");
}

Assistant:

Vec_Ptr_t * If_ManReverseOrder( If_Man_t * p )
{
    Vec_Ptr_t * vOrder;
    If_Obj_t * pObj, ** ppStore;
    int i;
    // allocate place to store the nodes
    ppStore = ABC_ALLOC( If_Obj_t *, p->nLevelMax + 1 );
    memset( ppStore, 0, sizeof(If_Obj_t *) * (p->nLevelMax + 1) );
    // add the nodes
    If_ManForEachObj( p, pObj, i )
    {
        assert( pObj->Level >= 0 && pObj->Level <= (unsigned)p->nLevelMax );
        pObj->pCopy = (char *)ppStore[pObj->Level]; 
        ppStore[pObj->Level] = pObj;
    }
    vOrder = Vec_PtrAlloc( If_ManObjNum(p) );
    for ( i = p->nLevelMax; i >= 0; i-- )
        for ( pObj = ppStore[i]; pObj; pObj = (If_Obj_t *)pObj->pCopy )
            Vec_PtrPush( vOrder, pObj );
    ABC_FREE( ppStore );
    // print the order
//    Vec_PtrForEachEntry( If_Obj_t *, vOrder, pObj, i )
//        Abc_Print( 1, "Obj %2d   Type %d  Level = %d\n", pObj->Id, pObj->Type, pObj->Level );
    return vOrder;
}